

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jitshared.c
# Opt level: O0

void emit_op_gettable(function *fn,int A,int B,int C,int pc,OpCode op)

{
  OpCode op_local;
  int pc_local;
  int C_local;
  int B_local;
  int A_local;
  function *fn_local;
  
  emit_reg(fn,"ra",A);
  emit_reg(fn,"rb",B);
  emit_reg_or_k(fn,"rc",C);
  emit_update_savedpc(fn,pc);
  if (op == OP_RAVI_GETFIELD) {
    membuff_add_string(&fn->body,"raviV_gettable_sskey(L, rb, rc, ra);\n");
  }
  else if (op == OP_RAVI_GETI) {
    membuff_add_string(&fn->body,"raviV_gettable_i(L, rb, rc, ra);\n");
  }
  else {
    membuff_add_string(&fn->body,"luaV_gettable(L, rb, rc, ra);\n");
  }
  membuff_add_string(&fn->body,"base = ci->u.l.base;\n");
  return;
}

Assistant:

static void emit_op_gettable(struct function *fn, int A, int B, int C, int pc, OpCode op) {
  (void)pc;
  emit_reg(fn, "ra", A);
  emit_reg(fn, "rb", B);
  emit_reg_or_k(fn, "rc", C);
  emit_update_savedpc(fn, pc);
  if (op == OP_RAVI_GETFIELD) {
    membuff_add_string(&fn->body, "raviV_gettable_sskey(L, rb, rc, ra);\n");
  }
  else if (op == OP_RAVI_GETI) {
    membuff_add_string(&fn->body, "raviV_gettable_i(L, rb, rc, ra);\n");
  }
  else {
    membuff_add_string(&fn->body, "luaV_gettable(L, rb, rc, ra);\n");
  }
  membuff_add_string(&fn->body, "base = ci->u.l.base;\n");
}